

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O3

void SEND(HttpResponse *res)

{
  int __fd;
  int iVar1;
  char *__file;
  bool bVar2;
  int __fd_00;
  int iVar3;
  ssize_t sVar4;
  long *plVar5;
  string *in_RCX;
  int iVar6;
  string headerStr;
  char buffer [4096];
  string local_1058;
  stat local_1038 [28];
  
  HttpResponse::getHeaderStr_abi_cxx11_(&local_1058,res);
  __fd = res->_fd;
  __file = res->filename;
  if (res->isChunked == true) {
    write_chunked(__fd,__file,(int)&local_1058,in_RCX);
  }
  else {
    iVar6 = res->start_pos;
    iVar1 = res->end_pos;
    __fd_00 = open(__file,0,0);
    iVar3 = stat(__file,local_1038);
    if (iVar3 < 0) {
      puts("st init err");
    }
    if (__fd_00 < 2) {
      printf("open %s error\n");
    }
    memset(local_1038,0,0x1000);
    sVar4 = write(__fd,local_1058._M_dataplus._M_p,local_1058._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wcnt:",5);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)sVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    if (iVar6 != 0) {
      lseek(__fd_00,(long)iVar6 << 0xc,0);
    }
    if (iVar1 < 1) {
      iVar6 = (int)local_1038[0].st_size;
      do {
        sVar4 = read(__fd_00,local_1038,0x1000);
        write(__fd,local_1038,(long)(int)sVar4);
        if ((int)sVar4 != 0x1000) break;
        bVar2 = 0x1000 < iVar6;
        iVar6 = iVar6 + -0x1000;
      } while (bVar2);
    }
    else {
      iVar6 = (iVar1 - iVar6) + 0x1000;
      do {
        sVar4 = read(__fd_00,local_1038,0x1000);
        write(__fd,local_1038,(long)(int)sVar4);
        iVar6 = iVar6 + -0x1000;
      } while (0x1000 < iVar6);
    }
    close(__fd_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SEND(HttpResponse &res)
    {
        string headerStr = res.getHeaderStr();
        if (res.IsChunked())
        {
            write_chunked(res._fd, res.filename, 1024, headerStr);
        }
        else
        {
            write_static(res._fd, res.filename, res.start_pos, res.end_pos, headerStr);
        }
    }